

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

statement_base * __thiscall
cs::method_for_do::translate
          (method_for_do *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  initializer_list<cs::statement_base_*> __l;
  int iVar1;
  const_reference pptVar2;
  token_base **pptVar3;
  undefined8 uVar4;
  size_type sVar5;
  element_type *__a;
  statement_base *ptr;
  token_base *ptVar6;
  bool in_stack_00000016;
  bool in_stack_00000017;
  instance_type *in_stack_00000018;
  iterator in_stack_00000020;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *parallel_list;
  tree_type<cs::token_base_*> *tree;
  string *in_stack_fffffffffffffdc8;
  internal_error *in_stack_fffffffffffffdd0;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *in_stack_fffffffffffffde0;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *this_00;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 uVar7;
  token_base *in_stack_fffffffffffffe10;
  context_t *in_stack_fffffffffffffe18;
  allocator *paVar8;
  statement_expression *in_stack_fffffffffffffe20;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *in_stack_fffffffffffffe28;
  statement_for *in_stack_fffffffffffffe30;
  shared_ptr<cs::context_type> local_1b8;
  undefined1 local_1a1;
  token_base *local_188;
  token_base **local_180;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *in_stack_fffffffffffffe88;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *in_stack_fffffffffffffe90;
  allocator local_c1;
  string local_c0 [32];
  tree_node *local_a0;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *local_98;
  undefined1 local_8a;
  allocator local_89;
  string local_88 [32];
  tree_node *local_68;
  undefined1 local_5d;
  allocator local_49;
  string local_48 [32];
  tree_node *local_28;
  tree_type<cs::token_base_*> *local_20;
  
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::front(in_stack_fffffffffffffde0);
  pptVar2 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                       in_stack_fffffffffffffdd0,(size_type)in_stack_fffffffffffffdc8);
  local_20 = token_expr::get_tree((token_expr *)*pptVar2);
  local_28 = (tree_node *)
             tree_type<cs::token_base_*>::root
                       ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffdc8);
  pptVar3 = tree_type<cs::token_base_*>::iterator::data((iterator *)in_stack_fffffffffffffe10);
  if (*pptVar3 == (token_base *)0x0) {
    local_5d = 1;
    uVar4 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"Null pointer accessed.",&local_49);
    internal_error::internal_error(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    local_5d = 0;
    __cxa_throw(uVar4,&internal_error::typeinfo,internal_error::~internal_error);
  }
  local_68 = (tree_node *)
             tree_type<cs::token_base_*>::root
                       ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffdc8);
  pptVar3 = tree_type<cs::token_base_*>::iterator::data((iterator *)in_stack_fffffffffffffe10);
  iVar1 = (*(*pptVar3)->_vptr_token_base[2])();
  if (iVar1 != 0xf) {
    local_8a = 1;
    uVar4 = __cxa_allocate_exception(0x28);
    paVar8 = &local_89;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_88,
               "Wrong grammar in for statement, expect <id> = <expression>, <condition>, <process>",
               paVar8);
    compile_error::compile_error
              ((compile_error *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    local_8a = 0;
    __cxa_throw(uVar4,&compile_error::typeinfo,compile_error::~compile_error);
  }
  local_a0 = (tree_node *)
             tree_type<cs::token_base_*>::root
                       ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffdc8);
  pptVar3 = tree_type<cs::token_base_*>::iterator::data((iterator *)in_stack_fffffffffffffe10);
  local_98 = token_parallel::get_parallel((token_parallel *)*pptVar3);
  sVar5 = std::
          deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
          ::size((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                  *)0x23cccc);
  if (sVar5 != 3) {
    uVar4 = __cxa_allocate_exception(0x28);
    paVar8 = &local_c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_c0,
               "Wrong grammar in for statement, expect <id> = <expression>, <condition>, <process>",
               paVar8);
    compile_error::compile_error
              ((compile_error *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    __cxa_throw(uVar4,&compile_error::typeinfo,compile_error::~compile_error);
  }
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x23cdbd);
  __a = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x23cdc9);
  uVar7 = 0;
  std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
  operator[]((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
              *)in_stack_fffffffffffffdd0,(size_type)in_stack_fffffffffffffdc8);
  tree_type<cs::token_base_*>::root((tree_type<cs::token_base_*> *)in_stack_fffffffffffffdc8);
  instance_type::check_define_var
            (in_stack_00000018,in_stack_00000020,in_stack_00000017,in_stack_00000016);
  ptr = (statement_base *)statement_base::operator_new((size_t)in_stack_fffffffffffffdd0);
  std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
  deque(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  ptVar6 = (token_base *)statement_base::operator_new((size_t)in_stack_fffffffffffffdd0);
  local_1a1 = 1;
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::front(in_stack_fffffffffffffde0);
  pptVar2 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                       in_stack_fffffffffffffdd0,(size_type)in_stack_fffffffffffffdc8);
  token_expr::get_tree((token_expr *)*pptVar2);
  tree_type<cs::token_base_*>::tree_type
            ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffdd0,
             (tree_type<cs::token_base_*> *)in_stack_fffffffffffffdc8);
  this_00 = (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&stack0xfffffffffffffe60;
  std::shared_ptr<cs::context_type>::shared_ptr
            ((shared_ptr<cs::context_type> *)in_stack_fffffffffffffdd0,
             (shared_ptr<cs::context_type> *)in_stack_fffffffffffffdc8);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           *)this_00);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::back(this_00);
  statement_expression::statement_expression
            (in_stack_fffffffffffffe20,(tree_type<cs::token_base_*> *)in_stack_fffffffffffffe18,
             (context_t *)in_stack_fffffffffffffe10,(token_base *)ptr);
  local_1a1 = 0;
  local_180 = &local_188;
  local_188 = ptVar6;
  std::allocator<cs::statement_base_*>::allocator((allocator<cs::statement_base_*> *)0x23cf1d);
  __l._M_len = (size_type)in_stack_fffffffffffffe10;
  __l._M_array = (iterator)ptr;
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
             CONCAT44(uVar7,in_stack_fffffffffffffe00),__l,(allocator_type *)__a);
  std::shared_ptr<cs::context_type>::shared_ptr
            (&local_1b8,(shared_ptr<cs::context_type> *)in_stack_fffffffffffffdc8);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           *)this_00);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::back(this_00);
  statement_for::statement_for
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
             (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
             in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x23cfa6);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
             in_stack_fffffffffffffe20);
  std::allocator<cs::statement_base_*>::~allocator((allocator<cs::statement_base_*> *)0x23cfc0);
  std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x23cfcd);
  tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x23cfda);
  std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
  ~deque((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
          *)in_stack_fffffffffffffe20);
  return ptr;
}

Assistant:

statement_base *
	method_for_do::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> &tree = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		if (tree.root().data() == nullptr)
			throw internal_error("Null pointer accessed.");
		if (tree.root().data()->get_type() != token_types::parallel)
			throw compile_error("Wrong grammar in for statement, expect <id> = <expression>, <condition>, <process>");
		auto &parallel_list = static_cast<token_parallel *>(tree.root().data())->get_parallel();
		if (parallel_list.size() != 3)
			throw compile_error("Wrong grammar in for statement, expect <id> = <expression>, <condition>, <process>");
		context->instance->check_define_var(parallel_list[0].root());
		return new statement_for(parallel_list, {
			new statement_expression(static_cast<token_expr *>(raw.front().at(3))->get_tree(),
			                         context, raw.front().back())
		}, context, raw.front().back());
	}